

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
SharedPtrTests_base_MemDestructor_Test::~SharedPtrTests_base_MemDestructor_Test
          (SharedPtrTests_base_MemDestructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SharedPtrTests_base, MemDestructor) {
	int* a;
	a = new int;
	*a = 1234;
	struct r {
		int* lakmus;
		r(int* f) {	lakmus = f;}
		~r() { *lakmus = 1; }
	};
	r *r1 = new r(a);
	SharedPtr<r> testingPtr(r1);
	testingPtr.~SharedPtr();
	EXPECT_EQ(*a,1);
}